

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O3

SHEMU_STATUS ShemuMemFetch(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Bytes)

{
  ulong uVar1;
  ulong uVar2;
  ND_BOOL NVar3;
  ND_SIZET index;
  long lVar4;
  ND_UINT64 NVar5;
  ulong uVar6;
  ulong uVar7;
  SHEMU_ICACHE *pSVar8;
  
  if (Size - 0x101 < 0xffffffffffffff00) {
    return 7;
  }
  uVar6 = Context->ShellcodeBase;
  lVar4 = Gla - uVar6;
  if (Gla < uVar6) {
    return 2;
  }
  uVar7 = Context->ShellcodeSize;
  if (uVar7 + uVar6 <= Gla) {
    return 2;
  }
  if (uVar7 < Size) {
    return 2;
  }
  uVar1 = Size + Gla;
  if (uVar1 <= uVar6) {
    return 2;
  }
  if (uVar7 + uVar6 < uVar1) {
    return 2;
  }
  if ((Context->Options & 0x20) == 0) {
    pSVar8 = (SHEMU_ICACHE *)Context->Shellcode;
    goto LAB_00164ca2;
  }
  uVar6 = (Context->Icache).Address;
  if (Gla < uVar6) {
LAB_00164c44:
    uVar7 = uVar7 - lVar4;
    (Context->Icache).Address = Gla;
    if (0xff < uVar7) {
      uVar7 = 0x100;
    }
    (Context->Icache).Size = uVar7;
    if (uVar7 < Size) {
      return 2;
    }
    if (Context->AccessShellcode == (ShemuMemAccess)0x0) {
      return 0xf;
    }
    NVar3 = (*Context->AccessShellcode)(Context,Gla,uVar7,(Context->Icache).Icache,'\0');
    if (NVar3 == '\0') {
      return 0xf;
    }
    uVar6 = (Context->Icache).Address;
  }
  else {
    NVar5 = (Context->Icache).Size;
    uVar2 = NVar5 + uVar6;
    if ((uVar2 <= Gla) || ((uVar2 <= uVar1 - 1 || uVar1 - 1 < uVar6) || NVar5 == 0))
    goto LAB_00164c44;
  }
  lVar4 = Gla - uVar6;
  pSVar8 = &Context->Icache;
LAB_00164ca2:
  if ((Bytes != (ND_UINT8 *)0x0) && (pSVar8->Icache + lVar4 != (ND_UINT8 *)0x0)) {
    NVar5 = 0;
    do {
      Bytes[NVar5] = (pSVar8->Icache + lVar4)[NVar5];
      NVar5 = NVar5 + 1;
    } while (Size != NVar5);
  }
  return 0;
}

Assistant:

SHEMU_STATUS
ShemuMemFetch(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Bytes
    )
{
    ND_UINT8 *addr;
    ND_UINT64 offset;

    if (Size > SHEMU_ICACHE_SIZE || Size == 0)
    {
        return SHEMU_ABORT_INVALID_PARAMETER;
    }

    if (!ShemuIsShellcodePtr(Context, Gla, Size))
    {
        return SHEMU_ABORT_RIP_OUTSIDE;
    }

    addr = Context->Shellcode;
    offset = Gla - Context->ShellcodeBase;

    if (0 != (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
    {
        // If the entire address is NOT inside the cache, re-fill the entire line, starting with Gla.
        if (!ShemuIsIcachePtr(Context, Gla, 1) || !ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            // Re-fill the line.
            Context->Icache.Address = Gla;
            Context->Icache.Size = MIN(SHEMU_ICACHE_SIZE, Context->ShellcodeSize - offset);

            if (Context->Icache.Size < Size)
            {
                return SHEMU_ABORT_RIP_OUTSIDE;
            }

            if ((ND_NULL == Context->AccessShellcode) || 
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Context->Icache.Size, Context->Icache.Icache, ND_FALSE))
            {
                return SHEMU_ABORT_FETCH_ERROR;
            }
        }

        addr = Context->Icache.Icache;
        offset = Gla - Context->Icache.Address;
    }

    shemu_memcpy(Bytes, addr + offset, (ND_SIZET)Size);

    return SHEMU_SUCCESS;
}